

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Reshape_x86::forward(Reshape_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  _func_int *p_Var4;
  ulong uVar5;
  int *piVar6;
  void *pvVar7;
  size_t sVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar14;
  bool bVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined1 uVar26;
  undefined1 uVar28;
  undefined1 uVar30;
  undefined1 uVar32;
  undefined4 uVar33;
  undefined1 uVar34;
  undefined1 uVar36;
  undefined1 uVar38;
  undefined1 uVar40;
  undefined8 uVar41;
  undefined4 uVar48;
  undefined1 uVar49;
  undefined1 uVar51;
  undefined1 uVar53;
  undefined1 uVar55;
  undefined8 uVar56;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined8 uVar67;
  undefined4 uVar74;
  undefined1 uVar75;
  undefined1 uVar77;
  undefined1 uVar79;
  undefined1 uVar81;
  undefined8 uVar82;
  int iVar89;
  int iVar90;
  uint uVar91;
  size_t sVar92;
  int iVar93;
  long lVar94;
  undefined4 uVar95;
  int iVar96;
  int iVar97;
  long lVar98;
  int unaff_EBX;
  int iVar99;
  ulong uVar100;
  undefined4 *puVar101;
  long lVar102;
  byte bVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  undefined1 (*pauVar107) [16];
  uint uVar108;
  long lVar109;
  long lVar110;
  undefined1 (*pauVar111) [16];
  long lVar112;
  int iVar113;
  int iVar114;
  uint uVar115;
  long lVar116;
  int iVar117;
  int iVar118;
  undefined4 *puVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  Mat bottom_blob_unpacked;
  long local_e8;
  long local_e0;
  Mat top_blob_unpacked;
  Option opt_pack;
  undefined4 uVar27;
  undefined3 uVar29;
  undefined2 uVar31;
  undefined4 uVar35;
  undefined3 uVar37;
  undefined2 uVar39;
  undefined1 uVar42;
  undefined1 uVar43;
  undefined3 uVar44;
  undefined1 uVar45;
  undefined2 uVar46;
  undefined1 uVar47;
  undefined4 uVar50;
  undefined3 uVar52;
  undefined2 uVar54;
  undefined1 uVar57;
  undefined1 uVar58;
  undefined3 uVar59;
  undefined1 uVar60;
  undefined2 uVar61;
  undefined1 uVar62;
  undefined1 uVar68;
  undefined1 uVar69;
  undefined3 uVar70;
  undefined1 uVar71;
  undefined2 uVar72;
  undefined1 uVar73;
  undefined4 uVar76;
  undefined3 uVar78;
  undefined2 uVar80;
  undefined1 uVar83;
  undefined1 uVar84;
  undefined3 uVar85;
  undefined1 uVar86;
  undefined2 uVar87;
  undefined1 uVar88;
  
  p_Var4 = this->_vptr_Reshape_x86[-3];
  if (*(int *)(&this->field_0xe0 + (long)p_Var4) == 1) {
    opt_pack.lightmode = opt->lightmode;
    opt_pack._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_pack.num_threads = opt->num_threads;
    opt_pack.workspace_allocator = opt->workspace_allocator;
    opt_pack.openmp_blocktime = opt->openmp_blocktime;
    opt_pack.use_winograd_convolution = opt->use_winograd_convolution;
    opt_pack.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_pack.use_int8_inference = opt->use_int8_inference;
    opt_pack.use_vulkan_compute = opt->use_vulkan_compute;
    opt_pack.use_bf16_storage = opt->use_bf16_storage;
    opt_pack.use_fp16_packed = opt->use_fp16_packed;
    opt_pack.use_fp16_storage = opt->use_fp16_storage;
    opt_pack.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_pack.use_int8_packed = opt->use_int8_packed;
    opt_pack.use_int8_storage = opt->use_int8_storage;
    opt_pack.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_pack.use_packing_layout = opt->use_packing_layout;
    opt_pack.use_shader_pack8 = opt->use_shader_pack8;
    opt_pack.use_subgroup_basic = opt->use_subgroup_basic;
    opt_pack.use_subgroup_vote = opt->use_subgroup_vote;
    opt_pack.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_pack.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_pack.use_image_storage = opt->use_image_storage;
    opt_pack.use_tensor_storage = opt->use_tensor_storage;
    opt_pack.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    opt_pack.flush_denormals = opt->flush_denormals;
    opt_pack.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_pack.use_reserved_1 = opt->use_reserved_1;
    opt_pack.use_reserved_2 = opt->use_reserved_2;
    opt_pack.use_reserved_3 = opt->use_reserved_3;
    opt_pack.use_reserved_4 = opt->use_reserved_4;
    opt_pack.use_reserved_5 = opt->use_reserved_5;
    opt_pack.use_reserved_6 = opt->use_reserved_6;
    opt_pack.use_reserved_7 = opt->use_reserved_7;
    opt_pack.use_reserved_8 = opt->use_reserved_8;
    opt_pack.use_reserved_9 = opt->use_reserved_9;
    opt_pack.use_reserved_10 = opt->use_reserved_10;
    opt_pack.use_reserved_11 = opt->use_reserved_11;
    opt_pack.blob_allocator = opt->workspace_allocator;
    bottom_blob_unpacked.cstep = 0;
    bottom_blob_unpacked.data = (void *)0x0;
    bottom_blob_unpacked.refcount._0_4_ = 0;
    bottom_blob_unpacked.refcount._4_4_ = 0;
    bottom_blob_unpacked.elemsize._0_4_ = 0;
    bottom_blob_unpacked.elemsize._4_4_ = 0;
    bottom_blob_unpacked.elempack = 0;
    bottom_blob_unpacked.allocator = (Allocator *)0x0;
    bottom_blob_unpacked.dims = 0;
    bottom_blob_unpacked.w = 0;
    bottom_blob_unpacked.h = 0;
    bottom_blob_unpacked.d = 0;
    bottom_blob_unpacked.c = 0;
    convert_packing(bottom_blob,&bottom_blob_unpacked,1,&opt_pack);
    top_blob_unpacked.cstep = 0;
    top_blob_unpacked.data = (void *)0x0;
    top_blob_unpacked.refcount._0_4_ = 0;
    top_blob_unpacked.refcount._4_4_ = 0;
    top_blob_unpacked.elemsize = 0;
    top_blob_unpacked.elempack = 0;
    top_blob_unpacked.allocator = (Allocator *)0x0;
    top_blob_unpacked.dims = 0;
    top_blob_unpacked.w = 0;
    top_blob_unpacked.h = 0;
    top_blob_unpacked.d = 0;
    top_blob_unpacked.c = 0;
    iVar89 = Reshape::forward((Reshape *)
                              ((long)&this->_vptr_Reshape_x86 + (long)this->_vptr_Reshape_x86[-3]),
                              &bottom_blob_unpacked,&top_blob_unpacked,&opt_pack);
    if (iVar89 == 0) {
      iVar96 = 1;
      if (opt->use_packing_layout == true) {
        auVar122._0_4_ = -(uint)((top_blob_unpacked.w & 3U) == 0);
        auVar122._4_4_ = -(uint)((top_blob_unpacked.w & 3U) == 0);
        auVar122._8_4_ = -(uint)((top_blob_unpacked.h & 3U) == 0);
        auVar122._12_4_ = -(uint)((top_blob_unpacked.h & 3U) == 0);
        uVar95 = movmskpd(1,auVar122);
        bVar14 = (bool)(((byte)uVar95 & 2) >> 1);
        if (top_blob_unpacked.dims != 2) {
          bVar14 = (bool)(top_blob_unpacked.dims == 1 & (byte)uVar95);
        }
        bVar15 = (top_blob_unpacked.c & 3U) == 0;
        if (1 < top_blob_unpacked.dims - 3U) {
          bVar15 = bVar14;
        }
        iVar96 = (uint)bVar15 * 3 + 1;
      }
      iVar89 = 0;
      convert_packing(&top_blob_unpacked,top_blob,iVar96,opt);
    }
    piVar6 = (int *)CONCAT44(top_blob_unpacked.refcount._4_4_,top_blob_unpacked.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (top_blob_unpacked.allocator == (Allocator *)0x0) {
          if (top_blob_unpacked.data != (void *)0x0) {
            free(top_blob_unpacked.data);
          }
        }
        else {
          (*(top_blob_unpacked.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar6 = (int *)CONCAT44(bottom_blob_unpacked.refcount._4_4_,bottom_blob_unpacked.refcount._0_4_
                            );
    if (piVar6 == (int *)0x0) {
      return iVar89;
    }
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 != 0) {
      return iVar89;
    }
    if (bottom_blob_unpacked.allocator == (Allocator *)0x0) {
      if (bottom_blob_unpacked.data != (void *)0x0) {
        free(bottom_blob_unpacked.data);
        return iVar89;
      }
      return iVar89;
    }
    (*(bottom_blob_unpacked.allocator)->_vptr_Allocator[3])();
    return iVar89;
  }
  if (*(int *)(&this->field_0xe4 + (long)p_Var4) == 1) {
    flatten(bottom_blob,top_blob,opt);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep != 0) {
      return 0;
    }
    return -100;
  }
  iVar89 = bottom_blob->elempack;
  iVar96 = bottom_blob->dims;
  uVar5 = bottom_blob->elemsize;
  iVar117 = bottom_blob->w;
  iVar114 = bottom_blob->h;
  iVar113 = bottom_blob->d;
  iVar93 = bottom_blob->c;
  iVar97 = iVar117 * iVar113 * iVar114 * iVar89 * iVar93;
  if (*(int *)(&this->field_0xe4 + (long)p_Var4) == 2) {
    iVar118 = 1;
    if (iVar96 == 1) {
      iVar118 = iVar89;
    }
    iVar118 = iVar118 * iVar117;
    if (*(int *)(&this->field_0xd0 + (long)p_Var4) != 0) {
      iVar118 = *(int *)(&this->field_0xd0 + (long)p_Var4);
    }
    iVar90 = 1;
    if (iVar96 == 2) {
      iVar90 = iVar89;
    }
    uVar91 = iVar90 * iVar114;
    if (*(uint *)(&this->field_0xd4 + (long)p_Var4) != 0) {
      uVar91 = *(uint *)(&this->field_0xd4 + (long)p_Var4);
    }
    uVar100 = (ulong)uVar91;
    if (iVar118 == -1) {
      iVar118 = iVar97 / (int)uVar91;
    }
    if (uVar91 == 0xffffffff) {
      uVar100 = (long)iVar97 / (long)iVar118 & 0xffffffff;
    }
    bVar103 = (uVar100 & 3) == 0 & opt->use_packing_layout;
    iVar90 = (uint)bVar103 + (uint)bVar103 * 2 + 1;
    sVar92 = uVar5 / (ulong)(long)iVar89 << bVar103 * '\x02';
    iVar99 = (int)uVar100;
    if (((iVar96 == 2) && (iVar114 * iVar89 == iVar99)) && (iVar89 == iVar90)) {
      if (top_blob != bottom_blob) {
        piVar6 = bottom_blob->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = top_blob->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        piVar6 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar6;
        top_blob->elemsize = bottom_blob->elemsize;
        top_blob->elempack = bottom_blob->elempack;
        top_blob->allocator = bottom_blob->allocator;
        iVar117 = bottom_blob->w;
        iVar114 = bottom_blob->h;
        iVar113 = bottom_blob->d;
        top_blob->dims = bottom_blob->dims;
        top_blob->w = iVar117;
        top_blob->h = iVar114;
        top_blob->d = iVar113;
        top_blob->c = bottom_blob->c;
        top_blob->cstep = bottom_blob->cstep;
      }
      bVar14 = false;
      unaff_EBX = 0;
    }
    else if (bVar103 == 0) {
      flatten(bottom_blob,top_blob,opt);
      if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) {
        unaff_EBX = -100;
      }
      else {
        top_blob->dims = 2;
        top_blob->w = iVar118;
        top_blob->h = iVar99;
        top_blob->cstep = (long)iVar99 * (long)iVar118;
        top_blob->elemsize = sVar92;
        top_blob->elempack = 1;
        unaff_EBX = 0;
      }
      bVar14 = false;
    }
    else {
      bottom_blob_unpacked.data = bottom_blob->data;
      piVar6 = bottom_blob->refcount;
      bottom_blob_unpacked.refcount._0_4_ = SUB84(piVar6,0);
      bottom_blob_unpacked.refcount._4_4_ = (undefined4)((ulong)piVar6 >> 0x20);
      bottom_blob_unpacked.elemsize._0_4_ = (undefined4)uVar5;
      bottom_blob_unpacked.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
      bottom_blob_unpacked.allocator = bottom_blob->allocator;
      bottom_blob_unpacked.cstep = bottom_blob->cstep;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      top_blob_unpacked.data = *(void **)opt;
      top_blob_unpacked.elemsize = (size_t)opt->workspace_allocator;
      uVar25 = opt->openmp_blocktime;
      uVar26 = opt->use_winograd_convolution;
      uVar28 = opt->use_sgemm_convolution;
      uVar30 = opt->use_int8_inference;
      uVar32 = opt->use_vulkan_compute;
      uVar31 = CONCAT11(uVar32,uVar30);
      uVar29 = CONCAT21(uVar31,uVar28);
      uVar27 = CONCAT31(uVar29,uVar26);
      top_blob_unpacked.allocator = *(Allocator **)&opt->use_bf16_storage;
      uVar41._0_1_ = opt->use_shader_pack8;
      uVar41._1_1_ = opt->use_subgroup_basic;
      uVar41._2_1_ = opt->use_subgroup_vote;
      uVar41._3_1_ = opt->use_subgroup_ballot;
      uVar42 = opt->use_subgroup_shuffle;
      uVar43 = opt->use_image_storage;
      uVar45 = opt->use_tensor_storage;
      uVar47 = opt->use_weight_fp16_storage;
      uVar46 = CONCAT11(uVar47,uVar45);
      uVar44 = CONCAT21(uVar46,uVar43);
      uVar41._4_4_ = CONCAT31(uVar44,uVar42);
      uVar48 = opt->flush_denormals;
      uVar49 = opt->use_local_pool_allocator;
      uVar51 = opt->use_reserved_1;
      uVar53 = opt->use_reserved_2;
      uVar55 = opt->use_reserved_3;
      uVar54 = CONCAT11(uVar55,uVar53);
      uVar52 = CONCAT21(uVar54,uVar51);
      uVar50 = CONCAT31(uVar52,uVar49);
      uVar56._0_1_ = opt->use_reserved_4;
      uVar56._1_1_ = opt->use_reserved_5;
      uVar56._2_1_ = opt->use_reserved_6;
      uVar56._3_1_ = opt->use_reserved_7;
      uVar57 = opt->use_reserved_8;
      uVar58 = opt->use_reserved_9;
      uVar60 = opt->use_reserved_10;
      uVar62 = opt->use_reserved_11;
      uVar61 = CONCAT11(uVar62,uVar60);
      uVar59 = CONCAT21(uVar61,uVar58);
      uVar56._4_4_ = CONCAT31(uVar59,uVar57);
      top_blob_unpacked.c = (int)uVar56;
      top_blob_unpacked.dims = (int)uVar41;
      top_blob_unpacked.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
      top_blob_unpacked.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      bottom_blob_unpacked.elempack = iVar89;
      bottom_blob_unpacked.dims = iVar96;
      bottom_blob_unpacked.w = iVar117;
      bottom_blob_unpacked.h = iVar114;
      bottom_blob_unpacked.d = iVar113;
      bottom_blob_unpacked.c = iVar93;
      top_blob_unpacked.elempack = uVar25;
      top_blob_unpacked._28_4_ = uVar27;
      top_blob_unpacked.w = uVar41._4_4_;
      top_blob_unpacked.h = uVar48;
      top_blob_unpacked.d = uVar50;
      top_blob_unpacked._60_4_ = uVar56._4_4_;
      flatten(bottom_blob,&bottom_blob_unpacked,(Option *)&top_blob_unpacked);
      if ((bottom_blob_unpacked.data == (void *)0x0) ||
         ((long)bottom_blob_unpacked.c * bottom_blob_unpacked.cstep == 0)) {
        bVar14 = false;
      }
      else {
        Mat::create(top_blob,iVar118,iVar99 / iVar90,sVar92,iVar90,opt->blob_allocator);
        if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) {
          bVar14 = false;
        }
        else {
          uVar91 = top_blob->h;
          bVar14 = true;
          if ((bVar103 & 0 < (int)uVar91) == 1) {
            uVar115 = top_blob->w;
            lVar116 = (long)(int)uVar115;
            lVar106 = lVar116 * 4;
            lVar110 = lVar116 * 0x10;
            local_e0 = lVar116 * 8;
            local_e8 = lVar116 * 0xc;
            iVar117 = 0;
            uVar100 = 0;
            do {
              iVar114 = top_blob->w;
              pvVar7 = top_blob->data;
              sVar92 = top_blob->elemsize;
              puVar119 = (undefined4 *)(uVar100 * (long)iVar114 * sVar92 + (long)pvVar7);
              if ((int)uVar115 < 4) {
                lVar94 = (long)(int)(uVar115 * 4 * (int)uVar100) * 4;
                lVar98 = (uVar100 * 4 + 1) * lVar116 * 4;
                lVar102 = (uVar100 * 4 + 2) * lVar116 * 4;
                lVar105 = (uVar100 * 4 + 3) * lVar116 * 4;
                uVar108 = 0;
              }
              else {
                iVar113 = 3;
                lVar105 = 0;
                do {
                  puVar101 = puVar119;
                  puVar3 = (undefined4 *)
                           ((long)bottom_blob_unpacked.data + lVar105 + (long)iVar117 * 4);
                  uVar95 = puVar3[1];
                  puVar2 = (undefined4 *)((long)bottom_blob_unpacked.data + lVar105 + lVar106);
                  uVar16 = puVar2[1];
                  puVar119 = (undefined4 *)((long)bottom_blob_unpacked.data + lVar105 + local_e0);
                  uVar17 = *puVar119;
                  uVar18 = puVar119[1];
                  uVar19 = puVar119[2];
                  uVar20 = puVar119[3];
                  puVar119 = (undefined4 *)((long)bottom_blob_unpacked.data + lVar105 + local_e8);
                  uVar21 = *puVar119;
                  uVar22 = puVar119[1];
                  uVar23 = puVar119[2];
                  uVar24 = puVar119[3];
                  auVar120._0_8_ = CONCAT44(puVar2[2],puVar3[2]);
                  auVar120._8_4_ = puVar3[3];
                  auVar120._12_4_ = puVar2[3];
                  puVar119 = (undefined4 *)
                             ((long)pvVar7 + lVar105 * 4 + sVar92 * uVar100 * (long)iVar114 + 0x40);
                  *(ulong *)(puVar119 + -0x10) = CONCAT44(*puVar2,*puVar3);
                  *(ulong *)(puVar119 + -0xe) = CONCAT44(uVar21,uVar17);
                  puVar119[-0xc] = uVar95;
                  puVar119[-0xb] = uVar16;
                  puVar119[-10] = uVar18;
                  puVar119[-9] = uVar22;
                  auVar13._8_4_ = uVar19;
                  auVar13._0_8_ = auVar120._0_8_;
                  auVar13._12_4_ = uVar23;
                  *(undefined1 (*) [16])(puVar119 + -8) = auVar13;
                  auVar11._8_4_ = uVar20;
                  auVar11._0_8_ = auVar120._8_8_;
                  auVar11._12_4_ = uVar24;
                  *(undefined1 (*) [16])(puVar119 + -4) = auVar11;
                  lVar105 = lVar105 + 0x10;
                  iVar113 = iVar113 + 4;
                } while (iVar113 < (int)uVar115);
                puVar119 = puVar101 + 0x10;
                lVar94 = lVar105 + (long)iVar117 * 4;
                lVar98 = lVar105 + lVar106;
                lVar102 = lVar105 + local_e0;
                lVar105 = lVar105 + local_e8;
                uVar108 = uVar115 & 0xfffffffc;
              }
              if ((int)uVar108 < (int)uVar115) {
                lVar109 = 0;
                do {
                  *puVar119 = *(undefined4 *)
                               ((long)bottom_blob_unpacked.data + lVar109 * 4 + lVar94);
                  puVar119[1] = *(undefined4 *)
                                 ((long)bottom_blob_unpacked.data + lVar109 * 4 + lVar98);
                  puVar119[2] = *(undefined4 *)
                                 ((long)bottom_blob_unpacked.data + lVar109 * 4 + lVar102);
                  puVar119[3] = *(undefined4 *)
                                 ((long)bottom_blob_unpacked.data + lVar109 * 4 + lVar105);
                  puVar119 = puVar119 + 4;
                  lVar109 = lVar109 + 1;
                } while (uVar115 - uVar108 != (int)lVar109);
              }
              uVar100 = uVar100 + 1;
              iVar117 = iVar117 + uVar115 * 4;
              lVar106 = lVar106 + lVar110;
              local_e0 = local_e0 + lVar110;
              local_e8 = local_e8 + lVar110;
            } while (uVar100 != uVar91);
            bVar14 = true;
          }
        }
      }
      piVar6 = (int *)CONCAT44(bottom_blob_unpacked.refcount._4_4_,
                               bottom_blob_unpacked.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (bottom_blob_unpacked.allocator == (Allocator *)0x0) {
            if (bottom_blob_unpacked.data != (void *)0x0) {
              free(bottom_blob_unpacked.data);
            }
          }
          else {
            (*(bottom_blob_unpacked.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      bottom_blob_unpacked.cstep = 0;
      bottom_blob_unpacked.data = (void *)0x0;
      bottom_blob_unpacked.refcount._0_4_ = 0;
      bottom_blob_unpacked.refcount._4_4_ = 0;
      bottom_blob_unpacked.elemsize._0_4_ = 0;
      bottom_blob_unpacked.elemsize._4_4_ = 0;
      bottom_blob_unpacked.elempack = 0;
      bottom_blob_unpacked.dims = 0;
      bottom_blob_unpacked.w = 0;
      bottom_blob_unpacked.h = 0;
      bottom_blob_unpacked.d = 0;
      bottom_blob_unpacked.c = 0;
      unaff_EBX = -100;
    }
    if (!bVar14) {
      return unaff_EBX;
    }
  }
  p_Var4 = this->_vptr_Reshape_x86[-3];
  if (1 < *(int *)(&this->field_0xe4 + (long)p_Var4) - 3U) {
    return 0;
  }
  iVar117 = *(int *)(&this->field_0xd8 + (long)p_Var4);
  iVar114 = 1;
  if (iVar96 == 1) {
    iVar114 = iVar89;
  }
  uVar91 = *(uint *)(&this->field_0xdc + (long)p_Var4);
  iVar114 = iVar114 * bottom_blob->w;
  if (*(int *)(&this->field_0xd0 + (long)p_Var4) != 0) {
    iVar114 = *(int *)(&this->field_0xd0 + (long)p_Var4);
  }
  iVar113 = 1;
  if (iVar96 == 2) {
    iVar113 = iVar89;
  }
  iVar113 = iVar113 * bottom_blob->h;
  if (*(int *)(&this->field_0xd4 + (long)p_Var4) != 0) {
    iVar113 = *(int *)(&this->field_0xd4 + (long)p_Var4);
  }
  if (*(int *)(&this->field_0xe4 + (long)p_Var4) == 3) {
    iVar93 = 1;
    if (iVar96 == 3) {
      iVar93 = iVar89;
    }
    if (uVar91 == 0) {
      uVar91 = iVar93 * bottom_blob->c;
    }
    uVar100 = (ulong)uVar91;
    if (iVar114 == -1) {
      iVar114 = (int)((long)((ulong)(uint)((int)((long)iVar97 / (long)(int)uVar91) >> 0x1f) << 0x20
                            | (long)iVar97 / (long)(int)uVar91 & 0xffffffffU) / (long)iVar113);
    }
    if (iVar113 == -1) {
      iVar113 = (int)((long)((ulong)(uint)((int)((long)iVar97 / (long)(int)uVar91) >> 0x1f) << 0x20
                            | (long)iVar97 / (long)(int)uVar91 & 0xffffffffU) / (long)iVar114);
    }
    if (uVar91 == 0xffffffff) {
LAB_00210d0f:
      uVar100 = (long)(iVar97 / iVar113) / (long)iVar114 & 0xffffffff;
    }
  }
  else {
    if (iVar117 == 0) {
      iVar117 = bottom_blob->d;
    }
    if (uVar91 == 0) {
      iVar93 = 1;
      if (iVar96 - 3U < 2) {
        iVar93 = iVar89;
      }
      uVar91 = iVar93 * bottom_blob->c;
    }
    uVar100 = (ulong)uVar91;
    if (iVar114 == -1) {
      uVar9 = (long)((ulong)(uint)((int)((long)iVar97 / (long)(int)uVar91) >> 0x1f) << 0x20 |
                    (long)iVar97 / (long)(int)uVar91 & 0xffffffffU) / (long)iVar117;
      iVar114 = (int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
                     (long)iVar113);
    }
    if (iVar113 == -1) {
      uVar9 = (long)((ulong)(uint)((int)((long)iVar97 / (long)(int)uVar91) >> 0x1f) << 0x20 |
                    (long)iVar97 / (long)(int)uVar91 & 0xffffffffU) / (long)iVar117;
      iVar113 = (int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
                     (long)iVar114);
    }
    if (iVar117 == -1) {
      uVar9 = (long)((ulong)(uint)((int)((long)iVar97 / (long)(int)uVar91) >> 0x1f) << 0x20 |
                    (long)iVar97 / (long)(int)uVar91 & 0xffffffffU) / (long)iVar113;
      iVar117 = (int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
                     (long)iVar114);
    }
    if (uVar91 == 0xffffffff) {
      iVar97 = iVar97 / iVar117;
      goto LAB_00210d0f;
    }
  }
  bVar103 = (uVar100 & 3) == 0 & opt->use_packing_layout;
  iVar97 = (uint)bVar103 + (uint)bVar103 * 2 + 1;
  sVar92 = uVar5 / (ulong)(long)iVar89 << bVar103 * '\x02';
  iVar93 = (int)uVar100;
  if (iVar96 == 4) {
    if ((bottom_blob->c * iVar89 != iVar93) || (iVar89 != iVar97)) goto LAB_00210dbc;
    Mat::operator=(top_blob,bottom_blob);
    top_blob->w = iVar114;
    top_blob->h = iVar113;
    top_blob->d = iVar117;
  }
  else {
    if (((iVar96 != 3) || (bottom_blob->c * iVar89 != iVar93)) || (iVar89 != iVar97)) {
LAB_00210dbc:
      bottom_blob_unpacked.data = bottom_blob->data;
      piVar6 = bottom_blob->refcount;
      bottom_blob_unpacked.refcount._0_4_ = SUB84(piVar6,0);
      bottom_blob_unpacked.refcount._4_4_ = (undefined4)((ulong)piVar6 >> 0x20);
      bottom_blob_unpacked.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
      bottom_blob_unpacked.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
      bottom_blob_unpacked.elempack = bottom_blob->elempack;
      bottom_blob_unpacked.allocator = bottom_blob->allocator;
      uVar63 = bottom_blob->dims;
      uVar64 = bottom_blob->w;
      uVar65 = bottom_blob->h;
      uVar66 = bottom_blob->d;
      bottom_blob_unpacked.c = bottom_blob->c;
      bottom_blob_unpacked.cstep = bottom_blob->cstep;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      top_blob_unpacked.data = *(void **)opt;
      top_blob_unpacked.elemsize = (size_t)opt->workspace_allocator;
      uVar33 = opt->openmp_blocktime;
      uVar34 = opt->use_winograd_convolution;
      uVar36 = opt->use_sgemm_convolution;
      uVar38 = opt->use_int8_inference;
      uVar40 = opt->use_vulkan_compute;
      uVar39 = CONCAT11(uVar40,uVar38);
      uVar37 = CONCAT21(uVar39,uVar36);
      uVar35 = CONCAT31(uVar37,uVar34);
      top_blob_unpacked.allocator = *(Allocator **)&opt->use_bf16_storage;
      uVar67._0_1_ = opt->use_shader_pack8;
      uVar67._1_1_ = opt->use_subgroup_basic;
      uVar67._2_1_ = opt->use_subgroup_vote;
      uVar67._3_1_ = opt->use_subgroup_ballot;
      uVar68 = opt->use_subgroup_shuffle;
      uVar69 = opt->use_image_storage;
      uVar71 = opt->use_tensor_storage;
      uVar73 = opt->use_weight_fp16_storage;
      uVar72 = CONCAT11(uVar73,uVar71);
      uVar70 = CONCAT21(uVar72,uVar69);
      uVar67._4_4_ = CONCAT31(uVar70,uVar68);
      uVar74 = opt->flush_denormals;
      uVar75 = opt->use_local_pool_allocator;
      uVar77 = opt->use_reserved_1;
      uVar79 = opt->use_reserved_2;
      uVar81 = opt->use_reserved_3;
      uVar80 = CONCAT11(uVar81,uVar79);
      uVar78 = CONCAT21(uVar80,uVar77);
      uVar76 = CONCAT31(uVar78,uVar75);
      uVar82._0_1_ = opt->use_reserved_4;
      uVar82._1_1_ = opt->use_reserved_5;
      uVar82._2_1_ = opt->use_reserved_6;
      uVar82._3_1_ = opt->use_reserved_7;
      uVar83 = opt->use_reserved_8;
      uVar84 = opt->use_reserved_9;
      uVar86 = opt->use_reserved_10;
      uVar88 = opt->use_reserved_11;
      uVar87 = CONCAT11(uVar88,uVar86);
      uVar85 = CONCAT21(uVar87,uVar84);
      uVar82._4_4_ = CONCAT31(uVar85,uVar83);
      top_blob_unpacked.c = (int)uVar82;
      top_blob_unpacked.dims = (int)uVar67;
      top_blob_unpacked.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
      top_blob_unpacked.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      bottom_blob_unpacked.dims = uVar63;
      bottom_blob_unpacked.w = uVar64;
      bottom_blob_unpacked.h = uVar65;
      bottom_blob_unpacked.d = uVar66;
      top_blob_unpacked.elempack = uVar33;
      top_blob_unpacked._28_4_ = uVar35;
      top_blob_unpacked.w = uVar67._4_4_;
      top_blob_unpacked.h = uVar74;
      top_blob_unpacked.d = uVar76;
      top_blob_unpacked._60_4_ = uVar82._4_4_;
      flatten(bottom_blob,&bottom_blob_unpacked,(Option *)&top_blob_unpacked);
      if (bottom_blob_unpacked.data == (void *)0x0 ||
          (long)bottom_blob_unpacked.c * bottom_blob_unpacked.cstep == 0) {
        unaff_EBX = -100;
        bVar14 = false;
      }
      else {
        if (*(int *)(&this->field_0xe4 + (long)this->_vptr_Reshape_x86[-3]) == 3) {
          Mat::create(top_blob,iVar114,iVar113,iVar93 / iVar97,sVar92,iVar97,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,iVar114,iVar113,iVar117,iVar93 / iVar97,sVar92,iVar97,
                      opt->blob_allocator);
        }
        if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) {
          bVar14 = false;
          unaff_EBX = -100;
        }
        else {
          uVar91 = top_blob->h * top_blob->w * top_blob->d;
          if (bVar103 != 0) {
            if (0 < top_blob->c) {
              lVar94 = (long)(int)uVar91;
              lVar106 = lVar94 * 4;
              lVar110 = lVar94 * 0xc;
              lVar98 = lVar94 * 0x10;
              lVar116 = lVar94 * 8;
              iVar89 = 0;
              lVar102 = 0;
              do {
                sVar92 = top_blob->cstep;
                pvVar7 = top_blob->data;
                sVar8 = top_blob->elemsize;
                puVar119 = (undefined4 *)(sVar92 * lVar102 * sVar8 + (long)pvVar7);
                if ((int)uVar91 < 4) {
                  lVar105 = (lVar102 * 4 + 3) * lVar94 * 4;
                  lVar109 = (lVar102 * 4 + 2) * lVar94 * 4;
                  lVar1 = (lVar102 * 4 + 1) * lVar94 * 4;
                  lVar112 = (long)(int)(uVar91 * 4 * (int)lVar102) * 4;
                  uVar115 = 0;
                }
                else {
                  iVar96 = 3;
                  lVar112 = 0;
                  do {
                    puVar101 = puVar119;
                    puVar2 = (undefined4 *)
                             ((long)bottom_blob_unpacked.data + lVar112 + (long)iVar89 * 4);
                    uVar95 = puVar2[1];
                    puVar3 = (undefined4 *)((long)bottom_blob_unpacked.data + lVar112 + lVar106);
                    uVar16 = puVar3[1];
                    puVar119 = (undefined4 *)((long)bottom_blob_unpacked.data + lVar112 + lVar116);
                    uVar17 = *puVar119;
                    uVar18 = puVar119[1];
                    uVar19 = puVar119[2];
                    uVar20 = puVar119[3];
                    puVar119 = (undefined4 *)((long)bottom_blob_unpacked.data + lVar112 + lVar110);
                    uVar21 = *puVar119;
                    uVar22 = puVar119[1];
                    uVar23 = puVar119[2];
                    uVar24 = puVar119[3];
                    auVar121._0_8_ = CONCAT44(puVar3[2],puVar2[2]);
                    auVar121._8_4_ = puVar2[3];
                    auVar121._12_4_ = puVar3[3];
                    puVar119 = (undefined4 *)
                               ((long)pvVar7 + lVar112 * 4 + sVar92 * sVar8 * lVar102 + 0x40);
                    *(ulong *)(puVar119 + -0x10) = CONCAT44(*puVar3,*puVar2);
                    *(ulong *)(puVar119 + -0xe) = CONCAT44(uVar21,uVar17);
                    puVar119[-0xc] = uVar95;
                    puVar119[-0xb] = uVar16;
                    puVar119[-10] = uVar18;
                    puVar119[-9] = uVar22;
                    auVar12._8_4_ = uVar19;
                    auVar12._0_8_ = auVar121._0_8_;
                    auVar12._12_4_ = uVar23;
                    *(undefined1 (*) [16])(puVar119 + -8) = auVar12;
                    auVar10._8_4_ = uVar20;
                    auVar10._0_8_ = auVar121._8_8_;
                    auVar10._12_4_ = uVar24;
                    *(undefined1 (*) [16])(puVar119 + -4) = auVar10;
                    iVar96 = iVar96 + 4;
                    lVar112 = lVar112 + 0x10;
                  } while (iVar96 < (int)uVar91);
                  puVar119 = puVar101 + 0x10;
                  lVar105 = lVar112 + lVar110;
                  lVar109 = lVar112 + lVar116;
                  lVar1 = lVar112 + lVar106;
                  lVar112 = lVar112 + (long)iVar89 * 4;
                  uVar115 = uVar91 & 0xfffffffc;
                }
                if (uVar91 - uVar115 != 0 && (int)uVar115 <= (int)uVar91) {
                  lVar104 = 0;
                  do {
                    *puVar119 = *(undefined4 *)
                                 ((long)bottom_blob_unpacked.data + lVar104 * 4 + lVar112);
                    puVar119[1] = *(undefined4 *)
                                   ((long)bottom_blob_unpacked.data + lVar104 * 4 + lVar1);
                    puVar119[2] = *(undefined4 *)
                                   ((long)bottom_blob_unpacked.data + lVar104 * 4 + lVar109);
                    puVar119[3] = *(undefined4 *)
                                   ((long)bottom_blob_unpacked.data + lVar104 * 4 + lVar105);
                    puVar119 = puVar119 + 4;
                    lVar104 = lVar104 + 1;
                  } while (uVar91 - uVar115 != (int)lVar104);
                }
                lVar102 = lVar102 + 1;
                lVar110 = lVar110 + lVar98;
                lVar116 = lVar116 + lVar98;
                lVar106 = lVar106 + lVar98;
                iVar89 = iVar89 + uVar91 * 4;
              } while (lVar102 < top_blob->c);
            }
            bVar14 = true;
            if (bVar103 != 0) goto LAB_002111ae;
          }
          bVar14 = true;
          if (0 < top_blob->c) {
            lVar106 = 0;
            do {
              pauVar107 = (undefined1 (*) [16])
                          (top_blob->cstep * lVar106 * top_blob->elemsize + (long)top_blob->data);
              pauVar111 = (undefined1 (*) [16])
                          (lVar106 * (int)uVar91 * 4 + (long)bottom_blob_unpacked.data);
              if ((int)uVar91 < 4) {
                uVar115 = 0;
              }
              else {
                iVar89 = 3;
                do {
                  *pauVar107 = *pauVar111;
                  pauVar111 = pauVar111 + 1;
                  pauVar107 = pauVar107 + 1;
                  iVar89 = iVar89 + 4;
                  uVar115 = uVar91 & 0xfffffffc;
                } while (iVar89 < (int)uVar91);
              }
              if (uVar91 - uVar115 != 0 && (int)uVar115 <= (int)uVar91) {
                lVar116 = 0;
                do {
                  *(undefined4 *)(*pauVar107 + lVar116 * 4) =
                       *(undefined4 *)(*pauVar111 + lVar116 * 4);
                  lVar116 = lVar116 + 1;
                } while (uVar91 - uVar115 != (int)lVar116);
              }
              lVar106 = lVar106 + 1;
            } while (lVar106 < top_blob->c);
          }
        }
      }
LAB_002111ae:
      piVar6 = (int *)CONCAT44(bottom_blob_unpacked.refcount._4_4_,
                               bottom_blob_unpacked.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (bottom_blob_unpacked.allocator == (Allocator *)0x0) {
            if (bottom_blob_unpacked.data != (void *)0x0) {
              free(bottom_blob_unpacked.data);
            }
          }
          else {
            (*(bottom_blob_unpacked.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      goto LAB_00211203;
    }
    Mat::operator=(top_blob,bottom_blob);
    top_blob->w = iVar114;
    top_blob->h = iVar113;
  }
  bVar14 = false;
  unaff_EBX = 0;
LAB_00211203:
  if (bVar14) {
    return 0;
  }
  return unaff_EBX;
}

Assistant:

int Reshape_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elempack = bottom_blob.elempack;

    if (permute == 1)
    {
        // TODO implement permute on-the-fly
        Option opt_pack = opt;
        opt_pack.blob_allocator = opt.workspace_allocator;

        Mat bottom_blob_unpacked;
        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack);

        Mat top_blob_unpacked;
        int ret = Reshape::forward(bottom_blob_unpacked, top_blob_unpacked, opt_pack);
        if (ret != 0)
            return ret;

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            // resolve dst_elempack
            int dims = top_blob_unpacked.dims;
#if __AVX__
            if (dims == 1) out_elempack = top_blob_unpacked.w % 8 == 0 ? 8 : top_blob_unpacked.w % 4 == 0 ? 4 : 1;
            if (dims == 2) out_elempack = top_blob_unpacked.h % 8 == 0 ? 8 : top_blob_unpacked.h % 4 == 0 ? 4 : 1;
            if (dims == 3 || dims == 4) out_elempack = top_blob_unpacked.c % 8 == 0 ? 8 : top_blob_unpacked.c % 4 == 0 ? 4 : 1;
#else
            if (dims == 1) out_elempack = top_blob_unpacked.w % 4 == 0 ? 4 : 1;
            if (dims == 2) out_elempack = top_blob_unpacked.h % 4 == 0 ? 4 : 1;
            if (dims == 3 || dims == 4) out_elempack = top_blob_unpacked.c % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);

        return 0;
    }

    if (ndim == 1)
    {
        // flatten
        flatten(bottom_blob, top_blob, opt);
        if (top_blob.empty())
            return -100;

        return 0;
    }

    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int total = bottom_blob.w * bottom_blob.h * bottom_blob.d * bottom_blob.c * elempack;

    if (ndim == 2)
    {
        int _w = w;
        int _h = h;

        if (_w == 0)
            _w = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
        if (_h == 0)
            _h = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;

        if (_w == -1)
            _w = total / _h;
        if (_h == -1)
            _h = total / _w;

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX__
            out_elempack = _h % 8 == 0 ? 8 : _h % 4 == 0 ? 4 : 1;
#else
            out_elempack = _h % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if (dims == 2 && bottom_blob.h * elempack == _h && elempack == out_elempack)
        {
            top_blob = bottom_blob;
            return 0;
        }

        if (out_elempack == 1)
        {
            // flatten
            flatten(bottom_blob, top_blob, opt);
            if (top_blob.empty())
                return -100;

            top_blob.dims = 2;
            top_blob.w = _w;
            top_blob.h = _h;
            top_blob.cstep = (size_t)_w * _h;
            top_blob.elemsize = out_elemsize;
            top_blob.elempack = out_elempack;

            return 0;
        }

        // flatten
        Mat bottom_blob_flattened = bottom_blob;
        {
            Option opt_flatten = opt;
            opt_flatten.blob_allocator = opt.workspace_allocator;

            flatten(bottom_blob, bottom_blob_flattened, opt_flatten);
            if (bottom_blob_flattened.empty())
                return -100;
        }

        top_blob.create(_w, _h / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int outw = top_blob.w;
        int outh = top_blob.h;

#if __SSE2__
#if __AVX__
        if (out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 8;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 8 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 8 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 8 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + outw * (i * 8 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + outw * (i * 8 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + outw * (i * 8 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + outw * (i * 8 + 7);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 7 < outw; j += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr0);
                    __m256 _row1 = _mm256_loadu_ps(ptr1);
                    __m256 _row2 = _mm256_loadu_ps(ptr2);
                    __m256 _row3 = _mm256_loadu_ps(ptr3);
                    __m256 _row4 = _mm256_loadu_ps(ptr4);
                    __m256 _row5 = _mm256_loadu_ps(ptr5);
                    __m256 _row6 = _mm256_loadu_ps(ptr6);
                    __m256 _row7 = _mm256_loadu_ps(ptr7);

                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    ptr3 += 8;
                    ptr4 += 8;
                    ptr5 += 8;
                    ptr6 += 8;
                    ptr7 += 8;
                    outptr += 64;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;

                    outptr += 8;
                }
            }
        }
#endif // __AVX__

        if (out_elempack == 4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 4;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 4 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 4 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 4 + 3);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr0);
                    __m128 _row1 = _mm_loadu_ps(ptr1);
                    __m128 _row2 = _mm_loadu_ps(ptr2);
                    __m128 _row3 = _mm_loadu_ps(ptr3);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr, _row0);
                    _mm_storeu_ps(outptr + 4, _row1);
                    _mm_storeu_ps(outptr + 8, _row2);
                    _mm_storeu_ps(outptr + 12, _row3);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    ptr3 += 4;
                    outptr += 16;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;

                    outptr += 4;
                }
            }
        }
#endif // __SSE2__
    }

    if (ndim == 3 || ndim == 4)
    {
        int _w = w;
        int _h = h;
        int _d = d;
        int _c = c;

        if (ndim == 3)
        {
            if (_w == 0)
                _w = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
            if (_h == 0)
                _h = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;
            if (_c == 0)
                _c = dims == 3 ? bottom_blob.c * elempack : bottom_blob.c;

            if (_w == -1)
                _w = total / _c / _h;
            if (_h == -1)
                _h = total / _c / _w;
            if (_c == -1)
                _c = total / _h / _w;
        }
        else // if (ndim == 4)
        {
            if (_w == 0)
                _w = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
            if (_h == 0)
                _h = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;
            if (_d == 0)
                _d = bottom_blob.d;
            if (_c == 0)
                _c = (dims == 3 || dims == 4) ? bottom_blob.c * elempack : bottom_blob.c;

            if (_w == -1)
                _w = total / _c / _d / _h;
            if (_h == -1)
                _h = total / _c / _d / _w;
            if (_d == -1)
                _d = total / _c / _h / _w;
            if (_c == -1)
                _c = total / _d / _h / _w;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX__
            out_elempack = _c % 8 == 0 ? 8 : _c % 4 == 0 ? 4 : 1;
#else
            out_elempack = _c % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if (dims == 3 && bottom_blob.c * elempack == _c && elempack == out_elempack)
        {
            top_blob = bottom_blob;
            top_blob.w = _w;
            top_blob.h = _h;
            return 0;
        }
        if (dims == 4 && bottom_blob.c * elempack == _c && elempack == out_elempack)
        {
            top_blob = bottom_blob;
            top_blob.w = _w;
            top_blob.h = _h;
            top_blob.d = _d;
            return 0;
        }

        // flatten
        Mat bottom_blob_flattened = bottom_blob;
        {
            Option opt_flatten = opt;
            opt_flatten.blob_allocator = opt.workspace_allocator;

            flatten(bottom_blob, bottom_blob_flattened, opt_flatten);
            if (bottom_blob_flattened.empty())
                return -100;
        }

        if (ndim == 3)
        {
            top_blob.create(_w, _h, _c / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        }
        else // if (ndim == 4)
        {
            top_blob.create(_w, _h, _d, _c / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        }
        if (top_blob.empty())
            return -100;

        int size = top_blob.w * top_blob.h * top_blob.d;

#if __SSE2__
#if __AVX__
        if (out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 8;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 8 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 8 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 8 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + size * (q * 8 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + size * (q * 8 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + size * (q * 8 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + size * (q * 8 + 7);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 7 < size; i += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr0);
                    __m256 _row1 = _mm256_loadu_ps(ptr1);
                    __m256 _row2 = _mm256_loadu_ps(ptr2);
                    __m256 _row3 = _mm256_loadu_ps(ptr3);
                    __m256 _row4 = _mm256_loadu_ps(ptr4);
                    __m256 _row5 = _mm256_loadu_ps(ptr5);
                    __m256 _row6 = _mm256_loadu_ps(ptr6);
                    __m256 _row7 = _mm256_loadu_ps(ptr7);

                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    ptr3 += 8;
                    ptr4 += 8;
                    ptr5 += 8;
                    ptr6 += 8;
                    ptr7 += 8;
                    outptr += 64;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;

                    outptr += 8;
                }
            }
        }
#endif // __AVX__

        if (out_elempack == 4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 4;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 4 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 4 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 4 + 3);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 3 < size; i += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr0);
                    __m128 _row1 = _mm_loadu_ps(ptr1);
                    __m128 _row2 = _mm_loadu_ps(ptr2);
                    __m128 _row3 = _mm_loadu_ps(ptr3);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr, _row0);
                    _mm_storeu_ps(outptr + 4, _row1);
                    _mm_storeu_ps(outptr + 8, _row2);
                    _mm_storeu_ps(outptr + 12, _row3);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    ptr3 += 4;
                    outptr += 16;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;

                    outptr += 4;
                }
            }
        }
#endif // __SSE2__

        if (out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr = (const float*)bottom_blob_flattened + size * q;
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _v = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(outptr, _v);
                    ptr += 8;
                    outptr += 8;
                }
#endif
                for (; i + 3 < size; i += 4)
                {
                    __m128 _v = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(outptr, _v);
                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}